

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbuffer.cpp
# Opt level: O0

void __thiscall QBuffer::disconnectNotify(QBuffer *this,QMetaMethod *signal)

{
  bool bVar1;
  QBufferPrivate *pQVar2;
  QMetaMethod *in_RSI;
  
  bVar1 = QMetaMethod::isValid(in_RSI);
  if (bVar1) {
    bVar1 = is_tracked_signal(in_RSI);
    if (bVar1) {
      pQVar2 = d_func((QBuffer *)0x274724);
      pQVar2->signalConnectionCount = pQVar2->signalConnectionCount + -1;
    }
  }
  else {
    pQVar2 = d_func((QBuffer *)0x27473e);
    pQVar2->signalConnectionCount = 0;
  }
  return;
}

Assistant:

void QBuffer::disconnectNotify(const QMetaMethod &signal)
{
    if (signal.isValid()) {
        if (is_tracked_signal(signal))
            d_func()->signalConnectionCount--;
    } else {
        d_func()->signalConnectionCount = 0;
    }
}